

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UDPServer.cpp
# Opt level: O3

int connect_group(in_port_t port,char *addr)

{
  int iVar1;
  int iVar2;
  u_int yes;
  undefined4 local_44;
  undefined8 local_40;
  sockaddr local_38;
  
  iVar1 = socket(2,2,0);
  iVar1 = no_err(iVar1,"socket");
  local_44 = 1;
  iVar2 = setsockopt(iVar1,1,0xf,&local_44,4);
  no_err(iVar2,"reuse");
  local_40 = 0;
  iVar2 = inet_aton(addr,(in_addr *)&local_40);
  no_err((uint)(iVar2 == 0),"inet_aton");
  iVar2 = setsockopt(iVar1,0,0x23,(in_addr *)&local_40,8);
  no_err(iVar2,"setsockopt");
  local_38.sa_data[6] = '\0';
  local_38.sa_data[7] = '\0';
  local_38.sa_data[8] = '\0';
  local_38.sa_data[9] = '\0';
  local_38.sa_data[10] = '\0';
  local_38.sa_data[0xb] = '\0';
  local_38.sa_data[0xc] = '\0';
  local_38.sa_data[0xd] = '\0';
  local_38.sa_family = 2;
  local_38.sa_data[2] = '\0';
  local_38.sa_data[3] = '\0';
  local_38.sa_data[4] = '\0';
  local_38.sa_data[5] = '\0';
  local_38.sa_data._0_2_ = port << 8 | port >> 8;
  iVar2 = bind(iVar1,&local_38,0x10);
  no_err(iVar2,"bind");
  iVar2 = fcntl(iVar1,4,0x800);
  no_err(iVar2,"set nonblock");
  return iVar1;
}

Assistant:

int connect_group(in_port_t port, const char *addr) {
  int sock = no_err(socket(AF_INET, SOCK_DGRAM, 0), "socket");
  u_int yes = 1;
  no_err(setsockopt(sock, SOL_SOCKET, SO_REUSEPORT, (char *) &yes, sizeof(yes)), "reuse");
  //Connect to group
  struct ip_mreq ip_mreq{};
  ip_mreq.imr_interface.s_addr = htonl(INADDR_ANY);
  no_err(inet_aton(addr, &ip_mreq.imr_multiaddr) == 0, "inet_aton");
  no_err(setsockopt(sock, IPPROTO_IP, IP_ADD_MEMBERSHIP, (void *) &ip_mreq, sizeof ip_mreq), "setsockopt");
  //Bind to port
  struct sockaddr_in local_address{};
  local_address.sin_family = AF_INET;
  local_address.sin_addr.s_addr = htonl(INADDR_ANY);
  local_address.sin_port = htons(port);
  no_err(bind(sock, (struct sockaddr *) &local_address, sizeof local_address), "bind");
  no_err(fcntl(sock, F_SETFL, O_NONBLOCK), "set nonblock");

  return sock;
}